

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

NanoVDBMediumProvider *
pbrt::NanoVDBMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  size_t *psVar1;
  float *pfVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8_t *puVar10;
  undefined1 auVar12 [12];
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [12];
  undefined1 auVar13 [16];
  undefined1 in_ZMM3 [64];
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  double local_f0;
  Allocator alloc_local;
  GridHandle<pbrt::NanoVDBBuffer> temperatureGrid;
  Float temperatureScale;
  Float temperatureCutoff;
  Float LeScale;
  GridHandle<pbrt::NanoVDBBuffer> densityGrid;
  Bounds3f bounds;
  string filename;
  
  auVar14 = in_ZMM3._4_12_;
  auVar12 = in_ZMM1._4_12_;
  psVar1 = &temperatureGrid.mBuffer.bytesAllocated;
  alloc_local = alloc;
  temperatureGrid.super_GridHandleBase._vptr_GridHandleBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&temperatureGrid,"filename","");
  local_110._0_8_ = &local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
  ParameterDictionary::GetOneString
            ((string *)&densityGrid,parameters,(string *)&temperatureGrid,(string *)local_110);
  ResolveFilename(&filename,(string *)&densityGrid);
  if (densityGrid.super_GridHandleBase._vptr_GridHandleBase !=
      (_func_int **)&densityGrid.mBuffer.bytesAllocated) {
    operator_delete(densityGrid.super_GridHandleBase._vptr_GridHandleBase,
                    densityGrid.mBuffer.bytesAllocated + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != &local_100) {
    operator_delete((void *)local_110._0_8_,local_100._M_allocated_capacity + 1);
  }
  if (temperatureGrid.super_GridHandleBase._vptr_GridHandleBase != (_func_int **)psVar1) {
    operator_delete(temperatureGrid.super_GridHandleBase._vptr_GridHandleBase,
                    temperatureGrid.mBuffer.bytesAllocated + 1);
  }
  if (filename._M_string_length != 0) {
    densityGrid.super_GridHandleBase._vptr_GridHandleBase = (_func_int **)&PTR__GridHandle_02d14b80;
    densityGrid.mBuffer.alloc.memoryResource = pstd::pmr::new_delete_resource();
    densityGrid.mBuffer.bytesAllocated = 0;
    densityGrid.mBuffer.ptr = (uint8_t *)0x0;
    local_110._0_8_ = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"density","");
    readGrid<pbrt::NanoVDBBuffer>(&temperatureGrid,&filename,(string *)local_110,loc,alloc_local);
    NanoVDBBuffer::operator=(&densityGrid.mBuffer,&temperatureGrid.mBuffer);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&temperatureGrid);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._0_8_ != &local_100) {
      operator_delete((void *)local_110._0_8_,local_100._M_allocated_capacity + 1);
    }
    iVar9 = (*densityGrid.super_GridHandleBase._vptr_GridHandleBase[2])();
    if (CONCAT44(extraout_var,iVar9) != 0) {
      puVar10 = (uint8_t *)0x0;
      if (*(int *)(densityGrid.mBuffer.ptr + 0x274) == 1) {
        puVar10 = densityGrid.mBuffer.ptr;
      }
      local_f0 = *(double *)(puVar10 + 0x238);
      auVar5 = *(undefined1 (*) [16])(puVar10 + 0x228);
      auVar6 = *(undefined1 (*) [16])(puVar10 + 0x240);
      dVar3 = *(double *)(puVar10 + 0x250);
      temperatureGrid.super_GridHandleBase._vptr_GridHandleBase =
           (_func_int **)&PTR__GridHandle_02d14b80;
      temperatureGrid.mBuffer.alloc.memoryResource = pstd::pmr::new_delete_resource();
      temperatureGrid.mBuffer.bytesAllocated = 0;
      temperatureGrid.mBuffer.ptr = (uint8_t *)0x0;
      pfVar2 = &bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = pfVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&bounds,"temperature","");
      readGrid<pbrt::NanoVDBBuffer>
                ((GridHandle<pbrt::NanoVDBBuffer> *)local_110,&filename,(string *)&bounds,loc,
                 alloc_local);
      NanoVDBBuffer::operator=(&temperatureGrid.mBuffer,(NanoVDBBuffer *)(local_110 + 8));
      nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
                ((GridHandle<pbrt::NanoVDBBuffer> *)local_110);
      if ((float *)bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ != pfVar2) {
        operator_delete((void *)bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_,
                        CONCAT44(bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z,
                                 bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y) + 1);
      }
      auVar5 = vcvtpd2ps_avx(auVar5);
      auVar11._0_4_ = (float)local_f0;
      auVar11._4_12_ = auVar12;
      auVar6 = vcvtpd2ps_avx(auVar6);
      auVar13._0_4_ = (float)dVar3;
      auVar13._4_12_ = auVar14;
      auVar7 = vminps_avx(auVar6,auVar5);
      auVar8 = vminss_avx(auVar13,auVar11);
      bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar7);
      bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar8._0_4_;
      auVar6 = vmaxps_avx(auVar6,auVar5);
      auVar5 = vmaxss_avx(auVar13,auVar11);
      uVar4 = vmovlps_avx(auVar6);
      bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar4;
      bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar4 >> 0x20);
      bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar5._0_4_;
      local_110._0_8_ = &local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"LeScale","");
      LeScale = ParameterDictionary::GetOneFloat(parameters,(string *)local_110,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != &local_100) {
        local_f0 = (double)CONCAT44(local_f0._4_4_,LeScale);
        operator_delete((void *)local_110._0_8_,local_100._M_allocated_capacity + 1);
        LeScale = SUB84(local_f0,0);
      }
      local_110._0_8_ = &local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"temperaturecutoff","");
      temperatureCutoff = ParameterDictionary::GetOneFloat(parameters,(string *)local_110,0.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != &local_100) {
        local_f0 = (double)CONCAT44(local_f0._4_4_,temperatureCutoff);
        operator_delete((void *)local_110._0_8_,local_100._M_allocated_capacity + 1);
        temperatureCutoff = SUB84(local_f0,0);
      }
      local_110._0_8_ = &local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"temperaturescale","");
      temperatureScale = ParameterDictionary::GetOneFloat(parameters,(string *)local_110,1.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != &local_100) {
        local_f0 = (double)CONCAT44(local_f0._4_4_,temperatureScale);
        operator_delete((void *)local_110._0_8_,local_100._M_allocated_capacity + 1);
        temperatureScale = SUB84(local_f0,0);
      }
      iVar9 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                        (alloc_local.memoryResource,0x78,8);
      pstd::pmr::polymorphic_allocator<std::byte>::
      construct<pbrt::NanoVDBMediumProvider,pbrt::Bounds3<float>&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&>
                (&alloc_local,(NanoVDBMediumProvider *)CONCAT44(extraout_var_00,iVar9),&bounds,
                 &densityGrid,&temperatureGrid,&LeScale,&temperatureCutoff,&temperatureScale);
      nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&temperatureGrid);
      nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(&densityGrid);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      return (NanoVDBMediumProvider *)CONCAT44(extraout_var_00,iVar9);
    }
    ErrorExit<std::__cxx11::string&>(loc,"%s: didn\'t find \"density\" grid.",&filename);
  }
  ErrorExit(loc,"Must supply \"filename\" to \"nanovdb\" medium.");
}

Assistant:

NanoVDBMediumProvider *NanoVDBMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    if (filename.empty())
        ErrorExit(loc, "Must supply \"filename\" to \"nanovdb\" medium.");

    nanovdb::GridHandle<NanoVDBBuffer> densityGrid;
    nanovdb::BBox<nanovdb::Vec3R> bbox;
    densityGrid = readGrid<NanoVDBBuffer>(filename, "density", loc, alloc);
    if (!densityGrid)
        ErrorExit(loc, "%s: didn't find \"density\" grid.", filename);

    bbox = densityGrid.grid<float>()->worldBBox();

    nanovdb::GridHandle<NanoVDBBuffer> temperatureGrid;
    temperatureGrid = readGrid<NanoVDBBuffer>(filename, "temperature", loc, alloc);

    Bounds3f bounds(Point3f(bbox.min()[0], bbox.min()[1], bbox.min()[2]),
                    Point3f(bbox.max()[0], bbox.max()[1], bbox.max()[2]));

    Float LeScale = parameters.GetOneFloat("LeScale", 1.f);
    Float temperatureCutoff = parameters.GetOneFloat("temperaturecutoff", 0.f);
    Float temperatureScale = parameters.GetOneFloat("temperaturescale", 1.f);

    return alloc.new_object<NanoVDBMediumProvider>(bounds, std::move(densityGrid),
                                                   std::move(temperatureGrid), LeScale,
                                                   temperatureCutoff, temperatureScale);
}